

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2008.h
# Opt level: O2

void __thiscall RBTS<UF>::PerformLabeling(RBTS<UF> *this)

{
  undefined8 uVar1;
  int iVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  bool bVar5;
  uint *puVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  int r_i;
  uint i;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  size_t capacity;
  int iVar16;
  long lVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  byte bVar23;
  ulong uVar24;
  CircularBuffer<int> e_queue;
  CircularBuffer<int> s_queue;
  Size local_38;
  int iVar17;
  
  uVar1 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_38.height = (int)uVar1;
  local_38.width = (int)((ulong)uVar1 >> 0x20);
  e_queue.buffer_._0_4_ = 0;
  cv::Mat_<int>::Mat_((Mat_<int> *)&s_queue,&local_38,(int *)&e_queue);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     (Mat *)&s_queue);
  cv::Mat::~Mat((Mat *)&s_queue);
  uVar1 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  UF::Alloc((((int)((ulong)uVar1 >> 0x20) + 1) / 2) * (((int)uVar1 + 1) / 2) + 1);
  *UF::P_ = 0;
  UF::length_ = 1;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar10 = *(uint *)&pMVar3->field_0x8;
  iVar2 = *(int *)&pMVar3->field_0xc;
  capacity = (size_t)(iVar2 / 2 + 2);
  CircularBuffer<int>::CircularBuffer(&s_queue,capacity);
  CircularBuffer<int>::CircularBuffer(&e_queue,capacity);
  uVar14 = 0;
  uVar24 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar24 = uVar14;
  }
  do {
    if (uVar14 == uVar24) {
      uVar10 = UF::Flatten();
      (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar10;
      pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      for (lVar11 = 0; puVar6 = UF::P_, lVar11 < *(int *)&pMVar4->field_0x8; lVar11 = lVar11 + 1) {
        lVar19 = **(long **)&pMVar4->field_0x48 * lVar11 + *(long *)&pMVar4->field_0x10;
        iVar2 = *(int *)&pMVar4->field_0xc;
        for (lVar21 = 0; (long)iVar2 * 4 != lVar21; lVar21 = lVar21 + 4) {
          *(uint *)(lVar19 + lVar21) = puVar6[*(uint *)(lVar19 + lVar21)];
        }
      }
      UF::Dealloc();
      CircularBuffer<int>::~CircularBuffer(&e_queue);
      CircularBuffer<int>::~CircularBuffer(&s_queue);
      return;
    }
    pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar19 = **(long **)&pMVar3->field_0x48 * uVar14 + *(long *)&pMVar3->field_0x10;
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar11 = **(long **)&pMVar4->field_0x48;
    lVar21 = lVar11 * uVar14 + *(long *)&pMVar4->field_0x10;
    lVar11 = lVar21 - lVar11;
    iVar20 = iVar2 * (int)uVar14;
    iVar16 = 0;
    while (iVar16 < iVar2) {
      lVar18 = (long)iVar16;
      iVar17 = iVar16;
      if (*(char *)(lVar19 + lVar18) != '\0') {
        iVar15 = iVar16 + iVar20;
        s_queue.size_ = s_queue.size_ + 1;
        s_queue.buffer_[s_queue.tail_] = iVar15;
        s_queue.tail_ = (s_queue.tail_ + 1) % s_queue.capacity_;
        iVar8 = iVar16;
        do {
          lVar18 = lVar18 + 1;
          iVar7 = iVar2;
          iVar17 = iVar2 + -1;
          if (iVar2 <= lVar18) break;
          iVar7 = iVar8 + 1;
          iVar17 = iVar8;
          iVar8 = iVar7;
        } while (*(char *)(lVar19 + lVar18) != '\0');
        iVar22 = iVar17 + iVar20;
        e_queue.size_ = e_queue.size_ + 1;
        *(int *)(CONCAT44(e_queue.buffer_._4_4_,e_queue.buffer_._0_4_) + e_queue.tail_ * 4) = iVar22
        ;
        e_queue.tail_ = (e_queue.tail_ + 1) % e_queue.capacity_;
        iVar8 = s_queue.buffer_[s_queue.head_];
        iVar9 = *(int *)(CONCAT44(e_queue.buffer_._4_4_,e_queue.buffer_._0_4_) + e_queue.head_ * 4);
        while (uVar10 = UF::length_, iVar9 < (int)((iVar15 - iVar2) - (uint)(iVar16 != 0))) {
          iVar8 = CircularBuffer<int>::DequeueAndFront(&s_queue);
          iVar9 = CircularBuffer<int>::DequeueAndFront(&e_queue);
        }
        iVar22 = iVar22 - iVar2;
        iVar7 = (uint)(iVar7 != iVar2) + iVar22;
        if (iVar7 < iVar8) {
          UF::P_[UF::length_] = UF::length_;
          UF::length_ = UF::length_ + 1;
          for (uVar13 = (long)iVar15 % (long)iVar2 & 0xffffffff;
              uVar13 < (iVar17 - iVar16) + (int)((long)iVar15 % (long)iVar2) + 1;
              uVar13 = uVar13 + 1) {
            *(uint *)(lVar21 + uVar13 * 4) = uVar10;
          }
        }
        else {
          uVar10 = *(uint *)(lVar11 + (long)(iVar8 % iVar2) * 4);
          iVar12 = (int)((long)iVar15 % (long)iVar2);
          for (uVar13 = (long)iVar15 % (long)iVar2 & 0xffffffff;
              uVar13 < (iVar17 - iVar16) + iVar12 + 1; uVar13 = uVar13 + 1) {
            *(uint *)(lVar21 + uVar13 * 4) = uVar10;
          }
          bVar5 = false;
          while (iVar9 <= iVar22) {
            if (bVar5) {
              UF::Merge(*(uint *)(lVar11 + (long)(iVar8 % iVar2) * 4),uVar10);
            }
            iVar8 = CircularBuffer<int>::DequeueAndFront(&s_queue);
            bVar5 = true;
            iVar9 = CircularBuffer<int>::DequeueAndFront(&e_queue);
          }
          bVar23 = bVar5 ^ 1;
          while( true ) {
            if (iVar22 < iVar9) break;
            bVar23 = 0;
            s_queue.head_ = (s_queue.head_ + 1) % s_queue.capacity_;
            e_queue.head_ = (e_queue.head_ + 1) % e_queue.capacity_;
            iVar8 = s_queue.buffer_[s_queue.head_];
            iVar9 = *(int *)(CONCAT44(e_queue.buffer_._4_4_,e_queue.buffer_._0_4_) +
                            e_queue.head_ * 4);
            e_queue.size_ = e_queue.size_ - 1;
            s_queue.size_ = s_queue.size_ - 1;
          }
          if (!(bool)(iVar7 < iVar8 | bVar23)) {
            UF::Merge(*(uint *)(lVar21 + (long)iVar12 * 4),
                      *(uint *)(lVar11 + (long)(iVar8 % iVar2) * 4));
          }
        }
      }
      iVar16 = iVar17 + 1;
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Scan Mask (Rosenfeld)
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols); // w = N in the paper naming convention
        int h(img_.rows);

        // Circular Buffers
        int buffer_capacity = w / 2 + 2;
        CircularBuffer<int> s_queue(buffer_capacity);
        CircularBuffer<int> e_queue(buffer_capacity);

        for (int r = 0; r < h; r += 1) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            // const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int*)(((char*)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 1) {

                // Is there a new run ?
                if (img_row[c] == 0) {
                    continue;
                }

                // clb (consider left border) and crb (consider right border) are used to handle border cases ignored by
                // the original paper.

                // Yes (new run)
                // 1) We need to record the new run r(s,e)
                int clb = c != 0; // Consider left border
                int s = s_queue.Enqueue(w * r + c++); // Current run starting index
                for (; c < w && img_row[c] > 0; c += 1) {}
                int crb = c != w; // Consider right border (derived by c - 1 != w - 1)
                int e = e_queue.Enqueue(w * r + --c); // Current run end index

                // 2) Discard all the runs until a run r(h,t) that end after/at s - N - 1 (t in the following scheme)
                // +-+-+-+-+-+-+-+-+-+
                // | |t|>| | | | | | |
                // +-+-+-+-+-+-+-+-+-+
                // | | |s| | | |e| | |
                // +-+-+-+-+-+-+-+-+-+
                // This run always exists. It is at most the run we just found.
                int h = s_queue.Front();
                int t = e_queue.Front();
                while (t < s - w - clb) {
                    h = s_queue.DequeueAndFront();
                    t = e_queue.DequeueAndFront();
                }

                // 3A) If the run r(h,t) starts before/at e - N + 1 (h in the following scheme)
                // +-+-+-+-+-+-+-+-+-+
                // | | | | | | |<|h| |
                // +-+-+-+-+-+-+-+-+-+
                // | | |s| | | |e| | |
                // +-+-+-+-+-+-+-+-+-+
                // it connects to the current run so we update the label of the current run
                // with that of the run(h,t), taking the value from p(h) -> p(r - 1, h % w)
                // The condition (e - w + 1) % w != 0 that can be simplified as (e + 1) % w != 0 
                // is for the handling of (left) border cases that were ignored by the original 
                // paper in which the border is always considered black (background).
                bool next = false;
                if (h <= e - w + crb) {
                    unsigned val = img_labels_row_prev[h % w];
                    unsigned start = s % w;
                    for (unsigned i = start; i < start + e - s + 1; ++i) {
                        img_labels_row[i] = val;
                    }

                    // 3B) Moreover, we check for all the following run that end before/at e - N (t
                    // in the following schema), we perform a label merge of that run with the
                    // current one and we remove them from the queues (no other following run can
                    // be directly connected with these).
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | |<|t| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // The label of the current run is val. The label of the run we are analyzing 
                    // from the queue is found at p(h) -> p(r - 1, h % w).
                    while (t <= e - w) {
                        if (next) {
                            LabelsSolver::Merge(img_labels_row_prev[h % w], val);
                        }
                        next = true;
                        h = s_queue.DequeueAndFront();
                        t = e_queue.DequeueAndFront();
                    }

                    // 4) We check for the next run which ends after/at e - N + 1 (t in the following
                    // schema. It always exists and it is at most the current run.
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | | | |t|>|
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    while (t < e - w + 1) {
                        next = true;
                        s_queue.Dequeue();
                        e_queue.Dequeue();
                        h = s_queue.Front();
                        t = e_queue.Front();
                    }

                    // We must keep the run in the list but we may need to merge labels:
                    // If the run p(h, t) starts before/at e - N + 1 (h in the following
                    // schema) it connects to the current run so we need to merge labels.
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | | |<|h| |
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // The condition (e - w + 1) % w != 0 that can be simplified as (e + 1) % w != 0 
                    // is for the handling of (left) border cases that were ignored by the original 
                    // paper in which the border is always considered black (background).
                    if (h <= e - w + crb) {
                        if (next) {
                            LabelsSolver::Merge(img_labels_row[s % w], img_labels_row_prev[h % w]);
                        }
                    }
                }
                else {
                    // Otherwise it is a run not connected to any other, so we need a new label
                    unsigned val = LabelsSolver::NewLabel();
                    unsigned start = s % w;
                    for (unsigned i = start; i < start + e - s + 1; ++i) {
                        img_labels_row[i] = val;
                    }
                }

            }//End columns's for
        }//End rows's for

        n_labels_ = LabelsSolver::Flatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int* img_labels_row_start = img_labels_.ptr<unsigned int>(r_i);
            unsigned int* img_labels_row_end = img_labels_row_start + img_labels_.cols;
            unsigned int* img_labels_row = img_labels_row_start;
            for (int c_i = 0; img_labels_row != img_labels_row_end; ++img_labels_row, ++c_i) {
                *img_labels_row = LabelsSolver::GetLabel(*img_labels_row);
            }
        }

        LabelsSolver::Dealloc();
    }